

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::level_projector(NavierStokesBase *this,Real dt,Real time,int iteration)

{
  int iVar1;
  int iVar2;
  NavierStokesBase *this_00;
  long in_RDI;
  Real cur_pres_time;
  int crse_dt_ratio;
  SyncRegister *crse_ptr;
  MultiFab *P_new;
  MultiFab *P_old;
  MultiFab *U_new;
  MultiFab *U_old;
  NavierStokesBase *in_stack_00000120;
  MultiFab *in_stack_00000a90;
  MultiFab *in_stack_00000a98;
  MultiFab *in_stack_00000aa0;
  Geometry *in_stack_00000aa8;
  Real in_stack_00000ab0;
  Real in_stack_00000ab8;
  Real in_stack_00000ac0;
  int in_stack_00000acc;
  Projection *in_stack_00000ad0;
  MultiFab *in_stack_00000ae0;
  MultiFab *in_stack_00000ae8;
  SyncRegister *in_stack_00000af0;
  SyncRegister *in_stack_00000af8;
  int in_stack_00000b00;
  int in_stack_00000b08;
  int in_stack_00000b10;
  size_type in_stack_fffffffffffffee8;
  NavierStokesBase *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  
  amrex::AmrLevel::get_old_data
            (&in_stack_fffffffffffffef0->super_AmrLevel,(int)(in_stack_fffffffffffffee8 >> 0x20));
  amrex::AmrLevel::get_new_data
            (&in_stack_fffffffffffffef0->super_AmrLevel,(int)(in_stack_fffffffffffffee8 >> 0x20));
  amrex::AmrLevel::get_old_data
            (&in_stack_fffffffffffffef0->super_AmrLevel,(int)(in_stack_fffffffffffffee8 >> 0x20));
  amrex::AmrLevel::get_new_data
            (&in_stack_fffffffffffffef0->super_AmrLevel,(int)(in_stack_fffffffffffffee8 >> 0x20));
  iVar1 = *(int *)(in_RDI + 8);
  iVar2 = amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
  if ((iVar1 < iVar2) && (do_sync_proj != 0)) {
    this_00 = getLevel(in_stack_fffffffffffffef0,(int)(in_stack_fffffffffffffee8 >> 0x20));
    getSyncReg(this_00);
  }
  if (0 < *(int *)(in_RDI + 8)) {
    amrex::Amr::nCycle((Amr *)in_stack_fffffffffffffef0,(int)(in_stack_fffffffffffffee8 >> 0x20));
  }
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  amrex::StateData::curTime
            ((StateData *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  get_rho_half_time(in_stack_00000120);
  Projection::level_project
            (in_stack_00000ad0,in_stack_00000acc,in_stack_00000ac0,in_stack_00000ab8,
             in_stack_00000ab0,in_stack_00000aa8,in_stack_00000aa0,in_stack_00000a98,
             in_stack_00000a90,in_stack_00000ae0,in_stack_00000ae8,in_stack_00000af0,
             in_stack_00000af8,in_stack_00000b00,in_stack_00000b08,in_stack_00000b10);
  return;
}

Assistant:

void
NavierStokesBase::level_projector (Real dt,
                                   Real time,
                                   int  iteration)
{
    BL_PROFILE_REGION_START("R::NavierStokesBase::level_projector()");
    BL_PROFILE("NavierStokesBase::level_projector()");

    AMREX_ASSERT(iteration > 0);

    MultiFab& U_old = get_old_data(State_Type);
    MultiFab& U_new = get_new_data(State_Type);
    MultiFab& P_old = get_old_data(Press_Type);
    MultiFab& P_new = get_new_data(Press_Type);

    SyncRegister* crse_ptr = 0;

    if (level < parent->finestLevel() && do_sync_proj)
    {
        crse_ptr = &(getLevel(level+1).getSyncReg());
    }

    int        crse_dt_ratio  = (level > 0) ? parent->nCycle(level) : -1;
    const Real cur_pres_time  = state[Press_Type].curTime();

    projector->level_project(level,time,dt,cur_pres_time,
                             geom,U_old,U_new,P_old,P_new,
                             get_rho_half_time(),crse_ptr,sync_reg,
                             crse_dt_ratio,iteration,have_divu);

    BL_PROFILE_REGION_STOP("R::NavierStokesBase::level_projector()");
}